

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O0

FString __thiscall TimidityMIDIDevice::GetStats(TimidityMIDIDevice *this)

{
  byte bVar1;
  long in_RSI;
  uint local_3c;
  int status;
  int used;
  int i;
  FString local_20;
  FString dots;
  TimidityMIDIDevice *this_local;
  FString *out;
  
  FString::FString(&local_20);
  FString::FString((FString *)this);
  FCriticalSection::Enter((FCriticalSection *)(in_RSI + 8));
  local_3c = 0;
  for (status = 0; status < *(int *)(*(long *)(in_RSI + 0x60) + 0x2c0); status = status + 1) {
    bVar1 = *(byte *)(*(long *)(*(long *)(in_RSI + 0x60) + 0x2a8) + (long)status * 0x170);
    if ((bVar1 & 1) == 0) {
      FString::operator<<(&local_20,"\x1cT.");
    }
    else {
      local_3c = local_3c + 1;
      if ((bVar1 & 2) == 0) {
        if ((bVar1 & 4) == 0) {
          if ((bVar1 & 8) == 0) {
            FString::operator<<(&local_20,"\x1cD");
          }
          else {
            FString::operator<<(&local_20,"\x1cG");
          }
        }
        else {
          FString::operator<<(&local_20,"\x1cI");
        }
      }
      else {
        FString::operator<<(&local_20,"\x1cH");
      }
      if (*(char *)(*(long *)(*(long *)(in_RSI + 0x60) + 0x2a8) + (long)status * 0x170 + 0x39) ==
          '\0') {
        FString::operator<<(&local_20,"+");
      }
      else {
        FString::operator<<(&local_20,
                            (char)*(undefined4 *)
                                   (*(long *)(*(long *)(in_RSI + 0x60) + 0x2a8) + 0x38 +
                                   (long)status * 0x170) + '0');
      }
    }
  }
  FCriticalSection::Leave((FCriticalSection *)(in_RSI + 8));
  FString::Format((FString *)this,"\x1cK%3d/%3d ",(ulong)local_3c,
                  (ulong)*(uint *)(*(long *)(in_RSI + 0x60) + 0x2c0));
  FString::operator+=((FString *)this,&local_20);
  if (*(int *)(*(long *)(in_RSI + 0x60) + 0x2c8) != 0 ||
      *(int *)(*(long *)(in_RSI + 0x60) + 0x2c4) != 0) {
    FString::AppendFormat
              ((FString *)this,"\x1cG %d/%d",(ulong)*(uint *)(*(long *)(in_RSI + 0x60) + 0x2c8),
               (ulong)*(uint *)(*(long *)(in_RSI + 0x60) + 0x2c4));
  }
  FString::~FString(&local_20);
  return (FString)(char *)this;
}

Assistant:

FString TimidityMIDIDevice::GetStats()
{
	FString dots;
	FString out;
	int i, used;

	CritSec.Enter();
	for (i = used = 0; i < Renderer->voices; ++i)
	{
		int status = Renderer->voice[i].status;

		if (!(status & Timidity::VOICE_RUNNING))
		{
			dots << TEXTCOLOR_PURPLE".";
		}
		else
		{
			used++;
			if (status & Timidity::VOICE_SUSTAINING)
			{
				dots << TEXTCOLOR_BLUE;
			}
			else if (status & Timidity::VOICE_RELEASING)
			{
				dots << TEXTCOLOR_ORANGE;
			}
			else if (status & Timidity::VOICE_STOPPING)
			{
				dots << TEXTCOLOR_RED;
			}
			else
			{
				dots << TEXTCOLOR_GREEN;
			}
			if (!Renderer->voice[i].eg1.env.bUpdating)
			{
				dots << "+";
			}
			else
			{
				dots << ('0' + Renderer->voice[i].eg1.gf1.stage);
			}
		}
	}
	CritSec.Leave();
	out.Format(TEXTCOLOR_YELLOW"%3d/%3d ", used, Renderer->voices);
	out += dots;
	if (Renderer->cut_notes | Renderer->lost_notes)
	{
		out.AppendFormat(TEXTCOLOR_RED" %d/%d", Renderer->cut_notes, Renderer->lost_notes);
	}
	return out;
}